

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Payload>
          (AsciiParser *this,vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result)

{
  bool bVar1;
  char local_151;
  uint local_150;
  char ce;
  undefined1 local_148 [7];
  bool triple_deliminated;
  Payload pl;
  char c;
  vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *result_local;
  AsciiParser *this_local;
  
  bVar1 = SkipWhitespace(this);
  if (bVar1) {
    bVar1 = Char1(this,(char *)((long)&pl.layerOffset._scale + 7));
    if (bVar1) {
      if (pl.layerOffset._scale._7_1_ == '[') {
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0066079b;
        }
        bVar1 = Char1(this,&local_151);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0066079b;
        }
        if (local_151 == ']') {
          ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(result);
          this_local._7_1_ = 1;
          goto LAB_0066079b;
        }
        Rewind(this,1);
        bVar1 = SepBy1BasicType<tinyusdz::Payload>(this,',',']',result);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0066079b;
        }
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0066079b;
        }
        bVar1 = Expect(this,']');
        if (!bVar1) {
          this_local._7_1_ = 0;
          goto LAB_0066079b;
        }
      }
      else {
        Rewind(this,1);
        Payload::Payload((Payload *)local_148);
        ce = '\0';
        bVar1 = ParsePayload(this,(Payload *)local_148,(bool *)&ce);
        if (bVar1) {
          ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::clear(result);
          ::std::vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>::push_back
                    (result,(value_type *)local_148);
        }
        else {
          this_local._7_1_ = 0;
        }
        local_150 = (uint)!bVar1;
        Payload::~Payload((Payload *)local_148);
        if (local_150 != 0) goto LAB_0066079b;
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0066079b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Payload> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  char c;
  if (!Char1(&c)) {
    return false;
  }

  if (c != '[') {
    Rewind(1);

    DCOUT("Guess non-list version");
    // Guess non-list version
    Payload pl;
    bool triple_deliminated{false};
    if (!ParsePayload(&pl, &triple_deliminated)) {
      return false;
    }

    (void)triple_deliminated;
    result->clear();
    result->push_back(pl);

  } else {

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // Empty array?
    {
      char ce;
      if (!Char1(&ce)) {
        return false;
      }

      if (ce == ']') {
        result->clear();
        return true;
      }

      Rewind(1);
    }

    if (!SepBy1BasicType(',', ']', result)) {
      return false;
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (!Expect(']')) {
      return false;
    }
  }

  return true;
}